

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_filter.cpp
# Opt level: O3

void __thiscall
duckdb::StatisticsPropagator::UpdateFilterStatistics
          (StatisticsPropagator *this,Expression *condition)

{
  ExpressionClass EVar1;
  BoundBetweenExpression *pBVar2;
  type pEVar3;
  type right;
  Expression *right_00;
  BoundComparisonExpression *pBVar4;
  ExpressionType comparison_type;
  
  EVar1 = (condition->super_BaseExpression).expression_class;
  if (EVar1 == BOUND_COMPARISON) {
    pBVar4 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                       (&condition->super_BaseExpression);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&pBVar4->left);
    right_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&pBVar4->right);
    comparison_type = (pBVar4->super_Expression).super_BaseExpression.type;
  }
  else {
    if (EVar1 != BOUND_BETWEEN) {
      return;
    }
    pBVar2 = BaseExpression::Cast<duckdb::BoundBetweenExpression>(&condition->super_BaseExpression);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&pBVar2->input);
    right = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (&pBVar2->lower);
    UpdateFilterStatistics(this,pEVar3,right,pBVar2->lower_inclusive * '\x02' + COMPARE_GREATERTHAN)
    ;
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&pBVar2->input);
    right_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&pBVar2->upper);
    comparison_type = pBVar2->upper_inclusive * '\x02' + COMPARE_LESSTHAN;
  }
  UpdateFilterStatistics(this,pEVar3,right_00,comparison_type);
  return;
}

Assistant:

void StatisticsPropagator::UpdateFilterStatistics(Expression &condition) {
	// in filters, we check for constant comparisons with bound columns
	// if we find a comparison in the form of e.g. "i=3", we can update our statistics for that column
	switch (condition.GetExpressionClass()) {
	case ExpressionClass::BOUND_BETWEEN: {
		auto &between = condition.Cast<BoundBetweenExpression>();
		UpdateFilterStatistics(*between.input, *between.lower, between.LowerComparisonType());
		UpdateFilterStatistics(*between.input, *between.upper, between.UpperComparisonType());
		break;
	}
	case ExpressionClass::BOUND_COMPARISON: {
		auto &comparison = condition.Cast<BoundComparisonExpression>();
		UpdateFilterStatistics(*comparison.left, *comparison.right, comparison.GetExpressionType());
		break;
	}
	default:
		break;
	}
}